

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-input.c
# Opt level: O0

int fy_parse_input_done(fy_parser *fyp)

{
  fy_input_type fVar1;
  fy_input *fyi_00;
  void *pvVar2;
  void *buf;
  fy_input *fyi;
  fy_parser *fyp_local;
  
  if (fyp == (fy_parser *)0x0) {
    return -1;
  }
  fyi_00 = fyp->current_input;
  if (fyi_00 == (fy_input *)0x0) {
    return 0;
  }
  fVar1 = (fyi_00->cfg).type;
  if (fVar1 == fyit_file) {
    if ((fyi_00->field_11).file.addr != (void *)0x0) goto LAB_00153523;
  }
  else if (fVar1 != fyit_stream) goto LAB_00153523;
  if (fyp == (fy_parser *)0x0) {
    fy_parser_diag((fy_parser *)0x0,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                   ,0x1aa,"fy_parse_input_done","no parser associated with input");
  }
  else {
    pvVar2 = realloc(fyi_00->buffer,fyp->current_input_pos);
    if ((pvVar2 != (void *)0x0) || (fyp->current_input_pos == 0)) {
      fyi_00->buffer = pvVar2;
      fyi_00->allocated = fyp->current_input_pos;
LAB_00153523:
      fy_parser_diag(fyp,0x20,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                     ,0x1b8,"fy_parse_input_done","moving current input to parsed inputs");
      fyi_00->state = FYIS_PARSED;
      fy_input_unref(fyi_00);
      fyp->current_input = (fy_input *)0x0;
      return 0;
    }
    fy_parser_diag(fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.c"
                   ,0x1ae,"fy_parse_input_done","realloc() failed");
  }
  return -1;
}

Assistant:

int fy_parse_input_done(struct fy_parser *fyp) {
    struct fy_input *fyi;
    void *buf;

    if (!fyp)
        return -1;

    fyi = fyp->current_input;
    if (!fyi)
        return 0;

    switch (fyi->cfg.type) {
        case fyit_file:
            if (fyi->file.addr)
                break;

            /* fall-through */

        case fyit_stream:
            fyp_error_check(fyp, fyp, err_out,
                            "no parser associated with input");
            /* chop extra buffer */
            buf = realloc(fyi->buffer, fyp->current_input_pos);
            fyp_error_check(fyp, buf || !fyp->current_input_pos, err_out,
                            "realloc() failed");

            fyi->buffer = buf;
            fyi->allocated = fyp->current_input_pos;
            break;
        default:
            break;

    }

    fyp_scan_debug(fyp, "moving current input to parsed inputs");

    fyi->state = FYIS_PARSED;
    fy_input_unref(fyi);

    fyp->current_input = NULL;

    return 0;

    err_out:
    return -1;
}